

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall SuperCardPro::ReadExact(SuperCardPro *this,void *buf,int len)

{
  uint in_EAX;
  int iVar1;
  int bytes_read;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  for (; 0 < len; len = len - uStack_28._4_4_) {
    iVar1 = (*this->_vptr_SuperCardPro[2])(this,buf,(ulong)(uint)len,(long)&uStack_28 + 4);
    if ((char)iVar1 == '\0') break;
    buf = (void *)((long)buf + (long)uStack_28._4_4_);
  }
  return len < 1;
}

Assistant:

bool SuperCardPro::ReadExact(void* buf, int len)
{
    uint8_t* p = reinterpret_cast<uint8_t*>(buf);
    auto bytes_read = 0;

    while (len > 0)
    {
        if (!Read(p, len, &bytes_read))
            return false;

        p += bytes_read;
        len -= bytes_read;
    }
    return true;
}